

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.hpp
# Opt level: O0

void __thiscall VariableDeclarationNode::~VariableDeclarationNode(VariableDeclarationNode *this)

{
  VariableDeclarationNode *in_RDI;
  
  ~VariableDeclarationNode(in_RDI);
  operator_delete(in_RDI,0x48);
  return;
}

Assistant:

VariableDeclarationNode(const std::string& name, 
    const TypeName& type, std::unique_ptr<ExpressionNode> value):
      name_(name), type_(type), value_(std::move(value)) {}